

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_glob_match(fio_str_info_s pat,fio_str_info_s ch)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  long lVar9;
  byte bVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *in_stack_00000010;
  byte *in_stack_00000018;
  long in_stack_00000028;
  byte *in_stack_00000030;
  byte *local_50;
  long local_48;
  byte *local_40;
  byte *local_38;
  
  local_40 = (byte *)0x0;
  local_48 = in_stack_00000028;
  local_50 = in_stack_00000030;
  local_38 = (byte *)0x0;
LAB_0010b162:
  while( true ) {
    lVar9 = -1;
    pbVar11 = (byte *)0x0;
    while( true ) {
      if (in_stack_00000028 == 0) {
        return (uint)(in_stack_00000010 == pbVar11);
      }
      bVar2 = *in_stack_00000030;
      pbVar12 = in_stack_00000018 + (long)pbVar11;
      bVar3 = *pbVar12;
      pbVar1 = in_stack_00000010 + lVar9;
      if (bVar3 != 0x2a) break;
      if (in_stack_00000010 + -1 == pbVar11) {
        return 1;
      }
      pbVar11 = pbVar11 + 1;
      lVar9 = lVar9 + -1;
      local_50 = in_stack_00000030;
      local_48 = in_stack_00000028;
      local_40 = pbVar1;
      local_38 = pbVar12 + 1;
    }
    if (bVar3 != 0x3f) break;
    in_stack_00000010 = in_stack_00000010 + lVar9;
    pbVar12 = in_stack_00000018 + (long)(pbVar11 + 1);
LAB_0010b2c4:
    in_stack_00000030 = in_stack_00000030 + 1;
    in_stack_00000018 = pbVar12;
    in_stack_00000028 = in_stack_00000028 + -1;
  }
  if (bVar3 != 0x5b) goto code_r0x0010b1eb;
  bVar3 = in_stack_00000018[(long)(pbVar11 + 1)];
  pbVar12 = in_stack_00000018 + (long)(pbVar11 + (ulong)(bVar3 == 0x5e) + 2);
  bVar6 = in_stack_00000018[(long)(pbVar11 + (ulong)(bVar3 == 0x5e) + 1)];
  bVar8 = false;
  do {
    bVar7 = bVar6;
    bVar10 = bVar6;
    bVar5 = *pbVar12;
    if (*pbVar12 == 0x2d) {
      bVar4 = pbVar12[1];
      bVar5 = 0x2d;
      if (bVar4 != 0x5d) {
        pbVar1 = pbVar12 + 2;
        pbVar12 = pbVar12 + 2;
        bVar7 = bVar4;
        if (bVar6 < bVar4) {
          bVar7 = bVar6;
        }
        bVar10 = bVar4;
        bVar5 = *pbVar1;
        if (bVar4 < bVar6) {
          bVar10 = bVar6;
        }
      }
    }
    bVar6 = bVar5;
    bVar8 = (bool)(bVar8 | (bVar2 <= bVar10 && bVar7 <= bVar2));
    pbVar12 = pbVar12 + 1;
  } while (bVar6 != 0x5d);
  if (bVar8 != (bVar3 == 0x5e)) {
    in_stack_00000010 =
         in_stack_00000018 + (long)(in_stack_00000010 + lVar9 + (long)pbVar11 + (1 - (long)pbVar12))
    ;
    goto LAB_0010b2c4;
  }
  goto LAB_0010b2e4;
code_r0x0010b1eb:
  if (bVar3 == 0x5c) {
    pbVar12 = pbVar11 + 2;
    bVar3 = in_stack_00000018[(long)(pbVar11 + 1)];
    lVar9 = -2 - (long)pbVar11;
  }
  else {
    pbVar12 = pbVar11 + 1;
  }
  in_stack_00000010 = in_stack_00000010 + lVar9;
  in_stack_00000018 = in_stack_00000018 + (long)pbVar12;
  in_stack_00000028 = in_stack_00000028 + -1;
  in_stack_00000030 = in_stack_00000030 + 1;
  if (bVar2 != bVar3) {
LAB_0010b2e4:
    if (local_38 == (byte *)0x0) {
      return 0;
    }
    in_stack_00000030 = local_50 + 1;
    local_48 = local_48 + -1;
    in_stack_00000010 = local_40;
    in_stack_00000018 = local_38;
    in_stack_00000028 = local_48;
    local_50 = in_stack_00000030;
  }
  goto LAB_0010b162;
}

Assistant:

static int fio_glob_match(fio_str_info_s pat, fio_str_info_s ch) {
  /* adapted and rewritten, with thankfulness, from the code at:
   * https://github.com/opnfv/kvmfornfv/blob/master/kernel/lib/glob.c
   *
   * Original version's copyright:
   * Copyright 2015 Open Platform for NFV Project, Inc. and its contributors
   * Under the MIT license.
   */

  /*
   * Backtrack to previous * on mismatch and retry starting one
   * character later in the string.  Because * matches all characters,
   * there's never a need to backtrack multiple levels.
   */
  uint8_t *back_pat = NULL, *back_str = (uint8_t *)ch.data;
  size_t back_pat_len = 0, back_str_len = ch.len;

  /*
   * Loop over each token (character or class) in pat, matching
   * it against the remaining unmatched tail of str.  Return false
   * on mismatch, or true after matching the trailing nul bytes.
   */
  while (ch.len) {
    uint8_t c = *(uint8_t *)ch.data++;
    uint8_t d = *(uint8_t *)pat.data++;
    ch.len--;
    pat.len--;

    switch (d) {
    case '?': /* Wildcard: anything goes */
      break;

    case '*':       /* Any-length wildcard */
      if (!pat.len) /* Optimize trailing * case */
        return 1;
      back_pat = (uint8_t *)pat.data;
      back_pat_len = pat.len;
      back_str = (uint8_t *)--ch.data; /* Allow zero-length match */
      back_str_len = ++ch.len;
      break;

    case '[': { /* Character class */
      uint8_t match = 0, inverted = (*(uint8_t *)pat.data == '^');
      uint8_t *cls = (uint8_t *)pat.data + inverted;
      uint8_t a = *cls++;

      /*
       * Iterate over each span in the character class.
       * A span is either a single character a, or a
       * range a-b.  The first span may begin with ']'.
       */
      do {
        uint8_t b = a;

        if (cls[0] == '-' && cls[1] != ']') {
          b = cls[1];

          cls += 2;
          if (a > b) {
            uint8_t tmp = a;
            a = b;
            b = tmp;
          }
        }
        match |= (a <= c && c <= b);
      } while ((a = *cls++) != ']');

      if (match == inverted)
        goto backtrack;
      pat.len -= cls - (uint8_t *)pat.data;
      pat.data = (char *)cls;

    } break;
    case '\\':
      d = *(uint8_t *)pat.data++;
      pat.len--;
    /* fallthrough */
    default: /* Literal character */
      if (c == d)
        break;
    backtrack:
      if (!back_pat)
        return 0; /* No point continuing */
      /* Try again from last *, one character later in str. */
      pat.data = (char *)back_pat;
      ch.data = (char *)++back_str;
      ch.len = --back_str_len;
      pat.len = back_pat_len;
    }
  }
  return !ch.len && !pat.len;
}